

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O3

size_t __thiscall
kj::_::BTreeImpl::verifyNode
          (BTreeImpl *this,size_t size,FunctionParam<bool_(unsigned_int,_unsigned_int)> *f,uint pos,
          uint height,MaybeUint maxRow)

{
  MaybeUint maxRow_00;
  NodeUnion *pNVar1;
  char cVar2;
  uint uVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  Fault f_1;
  Fault local_68;
  MaybeUint local_5c;
  BTreeImpl *local_58;
  ulong local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pNVar1 = this->tree;
  local_5c.i = maxRow.i;
  local_50 = size;
  if (height == 0) {
    iVar5 = 7;
    if (pNVar1[pos].field_0.freelist.zero[7] == 0) {
      iVar5 = 0;
    }
    uVar3 = (uint)(*(int *)((long)&pNVar1[pos].field_0 + (ulong)(uint)(iVar5 * 4) + 0x14) != 0);
    iVar9 = iVar5 + uVar3 * 4;
    bVar12 = *(int *)((long)&pNVar1[pos].field_0 + (ulong)(uint)(iVar9 * 4) + 0xc) != 0;
    uVar6 = iVar9 + (uint)bVar12 * 2;
    uVar10 = (uint)(*(int *)((long)&pNVar1[pos].field_0 + (ulong)uVar6 * 4 + 8) != 0);
    uVar6 = uVar6 + uVar10;
    sVar4 = (size_t)uVar6;
    if (uVar6 == 0) {
      sVar4 = 0;
    }
    else {
      local_58 = (BTreeImpl *)(ulong)(uVar6 - 1);
      lVar11 = 0;
      do {
        uVar8 = (ulong)(*(int *)((long)&pNVar1[pos].field_0 + lVar11 * 4 + 8) - 1);
        if (size <= uVar8) {
          local_68.exception = (Exception *)0x0;
          local_48 = 0;
          uStack_40 = 0;
          Debug::Fault::init(&local_68,
                             (EVP_PKEY_CTX *)
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            );
          Debug::Fault::fatal(&local_68);
        }
        if ((int)lVar11 + 1U < uVar6) {
          cVar2 = (**f->space[0])(f,uVar8,*(int *)((long)&pNVar1[pos].field_0 + lVar11 * 4 + 0xc) +
                                          -1);
          size = local_50;
          maxRow.i = local_5c.i;
          if (cVar2 == '\0') {
            local_68.exception = (Exception *)0x0;
            local_48 = 0;
            uStack_40 = 0;
            Debug::Fault::init(&local_68,
                               (EVP_PKEY_CTX *)
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                              );
            Debug::Fault::fatal(&local_68);
          }
        }
        else if ((maxRow.i != 0) &&
                (*(uint *)((long)&pNVar1[pos].field_0 + (long)local_58 * 4 + 8) != maxRow.i)) {
          local_68.exception = (Exception *)0x0;
          local_48 = 0;
          uStack_40 = 0;
          Debug::Fault::init(&local_68,
                             (EVP_PKEY_CTX *)
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            );
          Debug::Fault::fatal(&local_68);
        }
        lVar11 = lVar11 + 1;
      } while ((uint)bVar12 * 2 + iVar5 + uVar3 * 4 + uVar10 != (int)lVar11);
    }
  }
  else {
    bVar12 = pNVar1[pos].field_0.freelist.zero[3] != 0;
    uVar3 = (uint)bVar12 * 4 +
            (uint)(*(int *)((long)&pNVar1[pos].field_0 + (ulong)bVar12 * 0x10 + 8) != 0) * 2;
    uVar3 = *(int *)((long)&pNVar1[pos].field_0 + (ulong)uVar3 * 4 + 4) != 0 | uVar3;
    local_58 = this;
    if (uVar3 == 0) {
      lVar11 = 0;
    }
    else {
      lVar7 = 1;
      lVar11 = 0;
      while( true ) {
        maxRow_00.i = *(uint *)((long)&pNVar1[pos].field_0 + lVar7 * 4);
        if (local_50 <= maxRow_00.i - 1) {
          local_68.exception = (Exception *)0x0;
          local_48 = 0;
          uStack_40 = 0;
          Debug::Fault::init(&local_68,
                             (EVP_PKEY_CTX *)
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            );
          Debug::Fault::fatal(&local_68);
        }
        sVar4 = verifyNode(local_58,local_50,f,
                           *(uint *)((long)&pNVar1[pos].field_0 + lVar7 * 4 + 0x1c),height - 1,
                           maxRow_00);
        lVar11 = lVar11 + sVar4;
        if (uVar3 == (uint)lVar7) break;
        cVar2 = (**f->space[0])(f,*(int *)((long)&pNVar1[pos].field_0 + lVar7 * 4) + -1,
                                *(int *)((long)&pNVar1[pos].field_0 + lVar7 * 4 + 4) + -1);
        lVar7 = lVar7 + 1;
        if (cVar2 == '\0') {
          local_68.exception = (Exception *)0x0;
          local_48 = 0;
          uStack_40 = 0;
          Debug::Fault::init(&local_68,
                             (EVP_PKEY_CTX *)
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            );
          Debug::Fault::fatal(&local_68);
        }
      }
    }
    sVar4 = verifyNode(local_58,local_50,f,
                       *(uint *)((long)&pNVar1[pos].field_0 + (ulong)uVar3 * 4 + 0x20),height - 1,
                       local_5c);
    sVar4 = sVar4 + lVar11;
    if ((local_5c.i != 0) &&
       (cVar2 = (**f->space[0])(f,*(int *)((long)&pNVar1[pos].field_0 + (ulong)(uVar3 - 1) * 4 + 4)
                                  + -1,local_5c.i - 1), cVar2 == '\0')) {
      local_68.exception = (Exception *)0x0;
      local_48 = 0;
      uStack_40 = 0;
      Debug::Fault::init(&local_68,
                         (EVP_PKEY_CTX *)
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                        );
      Debug::Fault::fatal(&local_68);
    }
  }
  return sVar4;
}

Assistant:

size_t BTreeImpl::verifyNode(size_t size, FunctionParam<bool(uint, uint)>& f,
                             uint pos, uint height, MaybeUint maxRow) {
  if (height > 0) {
    auto& parent = tree[pos].parent;

    auto n = parent.keyCount();
    size_t total = 0;
    for (auto i: kj::zeroTo(n)) {
      KJ_ASSERT(*parent.keys[i] < size);
      total += verifyNode(size, f, parent.children[i], height - 1, parent.keys[i]);
      KJ_ASSERT(i + 1 == n || f(*parent.keys[i], *parent.keys[i + 1]));
    }
    total += verifyNode(size, f, parent.children[n], height - 1, maxRow);
    KJ_ASSERT(maxRow == nullptr || f(*parent.keys[n-1], *maxRow));
    return total;
  } else {
    auto& leaf = tree[pos].leaf;
    auto n = leaf.size();
    for (auto i: kj::zeroTo(n)) {
      KJ_ASSERT(*leaf.rows[i] < size);
      if (i + 1 < n) {
        KJ_ASSERT(f(*leaf.rows[i], *leaf.rows[i + 1]));
      } else {
        KJ_ASSERT(maxRow == nullptr || leaf.rows[n-1] == maxRow);
      }
    }
    return n;
  }
}